

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O0

Classifier __thiscall CLI::App::_recognize(App *this,string *current,bool ignore_used_subcommands)

{
  byte bVar1;
  bool bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  Classifier CVar5;
  char *pcVar6;
  undefined1 *puVar7;
  Option *pOVar8;
  ulong uVar9;
  App *pAVar10;
  byte in_DL;
  App *in_RSI;
  long in_RDI;
  Classifier res;
  App *cm;
  size_type dotloc;
  string dummy2;
  string dummy1;
  char *in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  undefined8 in_stack_fffffffffffffe88;
  string *in_stack_fffffffffffffe90;
  undefined6 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9e;
  undefined1 in_stack_fffffffffffffe9f;
  string *in_stack_fffffffffffffeb8;
  string *in_stack_fffffffffffffec0;
  string *in_stack_fffffffffffffec8;
  undefined2 uVar11;
  string *in_stack_fffffffffffffed0;
  App *in_stack_fffffffffffffed8;
  string *in_stack_fffffffffffffee0;
  undefined5 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeed;
  undefined1 in_stack_fffffffffffffeee;
  string *in_stack_ffffffffffffff00;
  App *in_stack_ffffffffffffff08;
  string local_d8 [32];
  App *local_b8;
  long local_b0;
  allocator<char> local_a3;
  undefined1 local_a2;
  undefined1 local_a1;
  undefined1 *local_a0;
  undefined8 local_98;
  string local_90 [32];
  undefined4 local_70;
  string local_60 [32];
  string local_40 [31];
  undefined1 in_stack_ffffffffffffffdf;
  undefined7 in_stack_ffffffffffffffe0;
  Classifier local_1;
  
  uVar3 = (undefined1)((ulong)in_stack_fffffffffffffe88 >> 0x38);
  bVar1 = in_DL & 1;
  ::std::__cxx11::string::string(local_40);
  ::std::__cxx11::string::string(local_60);
  bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                            in_stack_fffffffffffffe78);
  if (bVar2) {
    local_1 = POSITIONAL_MARK;
  }
  else {
    uVar3 = _valid_subcommand((App *)CONCAT17(in_stack_fffffffffffffe9f,
                                              CONCAT16(in_stack_fffffffffffffe9e,
                                                       in_stack_fffffffffffffe98)),
                              in_stack_fffffffffffffe90,(bool)uVar3);
    if ((bool)uVar3) {
      local_1 = SUBCOMMAND;
    }
    else {
      uVar4 = detail::split_long((string *)
                                 CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffeee,
                                                         CONCAT15(in_stack_fffffffffffffeed,
                                                                  in_stack_fffffffffffffee8))),
                                 in_stack_fffffffffffffee0,(string *)in_stack_fffffffffffffed8);
      if ((bool)uVar4) {
        local_1 = LONG;
      }
      else {
        bVar2 = detail::split_short(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                                    in_stack_fffffffffffffeb8);
        uVar11 = (undefined2)((ulong)in_stack_fffffffffffffec8 >> 0x30);
        if (bVar2) {
          pcVar6 = (char *)::std::__cxx11::string::operator[]((ulong)local_40);
          if ((('/' < *pcVar6) &&
              (pcVar6 = (char *)::std::__cxx11::string::operator[]((ulong)local_40), *pcVar6 < ':'))
             || (((pcVar6 = (char *)::std::__cxx11::string::operator[]((ulong)local_40),
                  *pcVar6 == '.' &&
                  ((uVar9 = ::std::__cxx11::string::empty(), (uVar9 & 1) == 0 &&
                   (pcVar6 = (char *)::std::__cxx11::string::operator[]((ulong)local_60),
                   '/' < *pcVar6)))) &&
                 (pcVar6 = (char *)::std::__cxx11::string::operator[]((ulong)local_60),
                 *pcVar6 < ':')))) {
            local_a2 = 0x2d;
            puVar7 = (undefined1 *)::std::__cxx11::string::operator[]((ulong)local_40);
            local_a1 = *puVar7;
            local_a0 = &local_a2;
            local_98 = 2;
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_90,local_a0,local_98,&local_a3);
            pOVar8 = get_option_no_throw(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
            ::std::__cxx11::string::~string(local_90);
            ::std::allocator<char>::~allocator(&local_a3);
            if (pOVar8 == (Option *)0x0) {
              local_1 = NONE;
              goto LAB_0015665e;
            }
          }
          local_1 = SHORT;
        }
        else if (((*(byte *)(in_RDI + 0x2dc) & 1) == 0) ||
                (bVar2 = detail::split_windows_style
                                   ((string *)
                                    CONCAT17(uVar3,CONCAT16(uVar4,CONCAT15(bVar2,
                                                  in_stack_fffffffffffffee8))),
                                    in_stack_fffffffffffffee0,(string *)in_stack_fffffffffffffed8),
                !bVar2)) {
          bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80)
                                    ,in_stack_fffffffffffffe78);
          if (((bVar2) && (uVar9 = ::std::__cxx11::string::empty(), (uVar9 & 1) == 0)) &&
             (*(long *)(in_RDI + 0x308) != 0)) {
            local_1 = SUBCOMMAND_TERMINATOR;
          }
          else {
            local_b0 = ::std::__cxx11::string::find_first_of((char)in_RSI,0x2e);
            if (local_b0 != -1) {
              ::std::__cxx11::string::substr((ulong)local_d8,(ulong)in_RSI);
              pAVar10 = _find_subcommand(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                                         SUB21((ushort)uVar11 >> 8,0),SUB21(uVar11,0));
              ::std::__cxx11::string::~string(local_d8);
              local_b8 = pAVar10;
              if (pAVar10 != (App *)0x0) {
                ::std::__cxx11::string::substr((ulong)&stack0xffffffffffffff00,(ulong)in_RSI);
                CVar5 = _recognize(in_RSI,(string *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                                   (bool)in_stack_ffffffffffffffdf);
                ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff00);
                if (CVar5 == SUBCOMMAND) {
                  local_1 = SUBCOMMAND;
                  goto LAB_0015665e;
                }
              }
            }
            local_1 = NONE;
          }
        }
        else {
          local_1 = WINDOWS_STYLE;
        }
      }
    }
  }
LAB_0015665e:
  local_70 = 1;
  ::std::__cxx11::string::~string(local_60);
  ::std::__cxx11::string::~string(local_40);
  return local_1;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE detail::Classifier App::_recognize(const std::string &current,
                                                                bool ignore_used_subcommands) const {
    std::string dummy1, dummy2;

    if(current == "--")
        return detail::Classifier::POSITIONAL_MARK;
    if(_valid_subcommand(current, ignore_used_subcommands))
        return detail::Classifier::SUBCOMMAND;
    if(detail::split_long(current, dummy1, dummy2))
        return detail::Classifier::LONG;
    if(detail::split_short(current, dummy1, dummy2)) {
        if((dummy1[0] >= '0' && dummy1[0] <= '9') ||
           (dummy1[0] == '.' && !dummy2.empty() && (dummy2[0] >= '0' && dummy2[0] <= '9'))) {
            // it looks like a number but check if it could be an option
            if(get_option_no_throw(std::string{'-', dummy1[0]}) == nullptr) {
                return detail::Classifier::NONE;
            }
        }
        return detail::Classifier::SHORT;
    }
    if((allow_windows_style_options_) && (detail::split_windows_style(current, dummy1, dummy2)))
        return detail::Classifier::WINDOWS_STYLE;
    if((current == "++") && !name_.empty() && parent_ != nullptr)
        return detail::Classifier::SUBCOMMAND_TERMINATOR;
    auto dotloc = current.find_first_of('.');
    if(dotloc != std::string::npos) {
        auto *cm = _find_subcommand(current.substr(0, dotloc), true, ignore_used_subcommands);
        if(cm != nullptr) {
            auto res = cm->_recognize(current.substr(dotloc + 1), ignore_used_subcommands);
            if(res == detail::Classifier::SUBCOMMAND) {
                return res;
            }
        }
    }
    return detail::Classifier::NONE;
}